

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O3

void __thiscall QString::QString(QString *this,QLatin1StringView latin1)

{
  storage_type_conflict *psVar1;
  char *__s;
  storage_type_conflict *psVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  qsizetype local_28;
  long local_20;
  
  __s = latin1.m_data;
  psVar2 = (storage_type_conflict *)latin1.m_size;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = (storage_type_conflict *)0x0;
  if (0 < (long)psVar2) {
    psVar1 = psVar2;
  }
  if (__s == (char *)0x0) {
    psVar1 = (storage_type_conflict *)0x0;
  }
  if (__s != (char *)0x0 && (long)psVar2 < 0) {
    psVar1 = (storage_type_conflict *)strlen(__s);
  }
  QVar3.m_data = psVar1;
  QVar3.m_size = (qsizetype)&local_38;
  ::QString::fromLatin1(QVar3);
  *(undefined4 *)&(this->d).d = local_38;
  *(undefined4 *)((long)&(this->d).d + 4) = uStack_34;
  *(undefined4 *)&(this->d).ptr = uStack_30;
  *(undefined4 *)((long)&(this->d).ptr + 4) = uStack_2c;
  (this->d).size = local_28;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QString::QString(QLatin1StringView latin1)
    : QString{QString::fromLatin1(latin1.data(), latin1.size())} {}